

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsTextItem::mouseDoubleClickEvent(QGraphicsTextItem *this,QGraphicsSceneMouseEvent *event)

{
  QGraphicsItem *this_00;
  bool bVar1;
  
  this_00 = (QGraphicsItem *)(this + 0x10);
  if (*(char *)(*(long *)(this + 0x20) + 0x2c) != '\x01') {
    bVar1 = QGraphicsItem::hasFocus(this_00);
    if (bVar1) {
      QGraphicsTextItemPrivate::sendControlEvent
                (*(QGraphicsTextItemPrivate **)(this + 0x20),(QEvent *)event);
      return;
    }
  }
  (*this_00->_vptr_QGraphicsItem[0x1a])(this_00,event);
  return;
}

Assistant:

void QGraphicsTextItem::mouseDoubleClickEvent(QGraphicsSceneMouseEvent *event)
{
    if (dd->useDefaultImpl) {
        QGraphicsItem::mouseDoubleClickEvent(event);
        return;
    }

    if (!hasFocus()) {
        QGraphicsItem::mouseDoubleClickEvent(event);
        return;
    }

    dd->sendControlEvent(event);
}